

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O3

int enum_dsk(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  finfo **ppfVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  DIR *__dirp;
  dirent *pdVar6;
  char *pcVar7;
  FINFO *__ptr;
  FPROP *pFVar8;
  size_t sVar9;
  finfo *pfVar11;
  byte *pbVar12;
  FINFO *pFVar13;
  char *__src;
  char fver [16];
  char tver [16];
  stat sbuf;
  char pname [255];
  char tname [255];
  char pext [255];
  char text [255];
  char namebuf [4096];
  int local_1514;
  FINFO *local_1510;
  char local_14e8 [16];
  char local_14d8 [16];
  stat local_14c8;
  byte local_1438 [256];
  byte local_1338 [256];
  char local_1238 [256];
  char local_1138 [256];
  byte local_1038 [4104];
  ulong uVar10;
  
  piVar5 = __errno_location();
  *piVar5 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar5 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar6 = readdir(__dirp);
      alarm(0);
      local_1510 = (FINFO *)0x0;
      local_1514 = 0;
      goto LAB_0011769c;
    }
  } while (*piVar5 == 4);
  alarm(0);
  goto LAB_0011762d;
LAB_0011769c:
  if (pdVar6 == (dirent *)0x0) {
    if (*piVar5 != 4) {
      closedir(__dirp);
      if (local_1514 < 1) {
        return local_1514;
      }
      *finfo_buf = local_1510;
      return local_1514;
    }
    goto LAB_00117a1b;
  }
  if (((pdVar6->d_name[0] == '.') &&
      ((pdVar6->d_name[1] == '\0' || ((pdVar6->d_name[1] == '.' && (pdVar6->d_name[2] == '\0'))))))
     || (pdVar6->d_ino == 0)) goto LAB_00117a1b;
  __src = pdVar6->d_name;
  strcpy((char *)local_1338,__src);
  if (local_1338[0] != 0) {
    pbVar12 = local_1338;
    bVar2 = local_1338[0];
    do {
      pbVar12 = pbVar12 + 1;
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        pbVar12[-1] = bVar2 | 0x20;
      }
      bVar2 = *pbVar12;
    } while (bVar2 != 0);
  }
  strcpy((char *)local_1438,name);
  if (local_1438[0] != 0) {
    pbVar12 = local_1438;
    bVar2 = local_1438[0];
    do {
      pbVar12 = pbVar12 + 1;
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        pbVar12[-1] = bVar2 | 0x20;
      }
      bVar2 = *pbVar12;
    } while (bVar2 != 0);
  }
  separate_version((char *)local_1338,local_14d8,0);
  pcVar7 = strrchr((char *)local_1338,0x2e);
  if (pcVar7 == (char *)0x0) {
    local_1138[0] = '\0';
  }
  else {
    *pcVar7 = '\0';
    strcpy(local_1138,pcVar7 + 1);
  }
  pcVar7 = strrchr((char *)local_1438,0x2e);
  if (pcVar7 == (char *)0x0) {
    local_1238[0] = '\0';
  }
  else {
    *pcVar7 = '\0';
    strcpy(local_1238,pcVar7 + 1);
  }
  iVar3 = match_pattern((char *)local_1338,(char *)local_1438);
  if (((iVar3 == 0) || (iVar3 = match_pattern(local_1138,local_1238), iVar3 == 0)) ||
     (iVar3 = match_pattern(local_14d8,ver), iVar3 == 0)) goto LAB_00117a1b;
  if (FreeFinfoList == (FINFO *)0x0) {
    __ptr = (FINFO *)calloc(1,0x228);
    pfVar11 = local_1510;
    if (__ptr == (FINFO *)0x0) goto LAB_00117ab0;
    pFVar8 = (FPROP *)calloc(1,0x118);
    __ptr->prop = pFVar8;
    if (pFVar8 == (FPROP *)0x0) {
      free(__ptr);
LAB_00117ab0:
      do {
        ppfVar1 = &pfVar11->next;
        pfVar11 = *ppfVar1;
      } while (*ppfVar1 != (finfo *)0x0);
      FreeFinfoList = local_1510;
      goto LAB_00117ac3;
    }
  }
  else {
    __ptr = FreeFinfoList;
    FreeFinfoList = FreeFinfoList->next;
  }
  __ptr->next = local_1510;
  sprintf((char *)local_1038,"%s/%s",dir,__src);
  alarm(TIMEOUT_TIME);
  do {
    *piVar5 = 0;
    iVar3 = stat((char *)local_1038,&local_14c8);
    if (iVar3 != -1) {
      alarm(0);
      goto LAB_001178e6;
    }
  } while (*piVar5 == 4);
  alarm(0);
  pfVar11 = __ptr;
  if (*piVar5 != 2) goto LAB_00117a7a;
LAB_001178e6:
  strcpy((char *)local_1038,__src);
  if ((local_14c8.st_mode & 0xf000) == 0x4000) {
    __ptr->dirp = 1;
    quote_dname((char *)local_1038);
    strcpy(__ptr->lname,(char *)local_1038);
    sVar9 = strlen((char *)local_1038);
    (__ptr->lname + sVar9)[0] = '>';
    (__ptr->lname + sVar9)[1] = '\0';
    sVar9 = sVar9 + 1;
  }
  else {
    __ptr->dirp = 0;
    quote_fname((char *)local_1038);
    sVar9 = strlen((char *)local_1038);
    strcpy(__ptr->lname,(char *)local_1038);
    __ptr->lname[sVar9] = '\0';
  }
  __ptr->lname_len = sVar9;
  strcpy((char *)local_1038,__src);
  separate_version((char *)local_1038,local_14e8,1);
  if (local_1038[0] != 0) {
    pbVar12 = local_1038;
    bVar2 = local_1038[0];
    do {
      pbVar12 = pbVar12 + 1;
      if ((byte)(bVar2 + 0xbf) < 0x1a) {
        pbVar12[-1] = bVar2 | 0x20;
      }
      bVar2 = *pbVar12;
    } while (bVar2 != 0);
  }
  strcpy(__ptr->no_ver_name,(char *)local_1038);
  if (local_14e8[0] == '\0') {
    uVar4 = 0;
  }
  else {
    uVar10 = strtoul(local_14e8,(char **)0x0,10);
    uVar4 = (uint)uVar10;
  }
  __ptr->version = uVar4;
  __ptr->ino = local_14c8.st_ino;
  local_1514 = local_1514 + 1;
  local_1510 = __ptr;
LAB_00117a1b:
  *piVar5 = 0;
  alarm(TIMEOUT_TIME);
  pdVar6 = readdir(__dirp);
  alarm(0);
  goto LAB_0011769c;
LAB_00117a7a:
  do {
    pFVar13 = pfVar11;
    pfVar11 = pFVar13->next;
  } while (pfVar11 != (finfo *)0x0);
  pFVar13->next = FreeFinfoList;
  FreeFinfoList = __ptr;
LAB_00117ac3:
  closedir(__dirp);
LAB_0011762d:
  *Lisp_errno = *piVar5;
  return -1;
}

Assistant:

static int enum_dsk(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];
  char fver[VERSIONLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      separate_version(namebuf, fver, 1);
      DOWNCASE(namebuf);
      strcpy(nextp->no_ver_name, namebuf);
      if (*fver == '\0')
        nextp->version = 0;
      else
        nextp->version = strtoul(fver, (char **)NULL, 10);
      nextp->ino = sbuf.st_ino;
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}